

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O1

double rtmidi_in_get_message(RtMidiInPtr device,uchar *message,size_t *size)

{
  double dVar1;
  pointer puVar2;
  ulong uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = MidiInApi::getMessage(*(MidiInApi **)((long)device->ptr + 8),&local_38);
  puVar2 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar3 != 0) && (uVar3 <= *size)) {
    memcpy(message,local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(long)(int)uVar3);
  }
  *size = uVar3;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)local_38.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  return dVar1;
}

Assistant:

double rtmidi_in_get_message (RtMidiInPtr device,
                              unsigned char *message,
                              size_t *size)
{
    try {
        // FIXME: use allocator to achieve efficient buffering
        std::vector<unsigned char> v;
        double ret = ((RtMidiIn*) device->ptr)->getMessage (&v);

        if (v.size () > 0 && v.size() <= *size) {
            memcpy (message, v.data (), (int) v.size ());
        }

        *size = v.size();
        return ret;
    }
    catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        return -1;
    }
    catch (...) {
        device->ok  = false;
        device->msg = "Unknown error";
        return -1;
    }
}